

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Initialize
          (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *this,
          uint32 capacity)

{
  Memory *this_00;
  Entry *pEVar1;
  TrackAllocData local_40;
  uint32 local_18;
  uint32 local_14;
  uint32 desiredSize;
  uint32 capacity_local;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *this_local;
  
  local_14 = capacity;
  _desiredSize = this;
  if (this->m_hashArray != (Entry *)0x0) {
    TTDAbort_unrecoverable_error("Should not already be initialized.");
  }
  local_18 = capacity * 2;
  LoadValuesForHashTables(local_18,&this->m_capacity,&this->m_h1Prime,&this->m_h2Prime);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)
             &TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>::Entry::typeinfo,
             0,(ulong)this->m_capacity,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Debug/TTSupport.h"
             ,0x4c4);
  this_00 = (Memory *)
            Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_40);
  pEVar1 = Memory::
           AllocateArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>::Entry,true>
                     (this_00,(HeapAllocator *)Memory::HeapAllocator::NoThrowAllocZero,0,
                      (ulong)this->m_capacity);
  pEVar1 = TTD_MEM_ALLOC_CHECK<TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapType::SnapHandler*>::Entry>
                     (pEVar1);
  this->m_hashArray = pEVar1;
  return;
}

Assistant:

void Initialize(uint32 capacity)
        {
            TTDAssert(this->m_hashArray == nullptr, "Should not already be initialized.");

            uint32 desiredSize = capacity * TTD_DICTIONARY_LOAD_FACTOR;

            LoadValuesForHashTables(desiredSize, &(this->m_capacity), &(this->m_h1Prime), &(this->m_h2Prime));

            this->m_hashArray = TT_HEAP_ALLOC_ARRAY_ZERO(Entry, this->m_capacity);
        }